

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_GetSetFactor_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_GetSetFactor_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  AssertionResult gtest_ar;
  FactorType newFactor;
  ParticleType particle;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
            (&particle,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this);
  newFactor = 6523.54;
  particle.factor = 6523.54;
  local_70.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40b97b8a3d70a3d7
  ;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"newFactor","particle.getFactor()",&newFactor,(double *)&local_70
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0xbe,message);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetFactor) 
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    ParticleType particle = this->randomParticle();
    FactorType newFactor = 6523.54;
    particle.setFactor(newFactor);
    ASSERT_EQ(newFactor, particle.getFactor());
}